

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::StringUtil::SplitWithParentheses
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,string *str,char delimiter,char par_open,char par_close)

{
  InvalidInputException *pIVar1;
  ulong uVar2;
  char ch;
  allocator local_109;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  string current;
  string local_e0;
  stack<char,_std::deque<char,_std::allocator<char>_>_> parentheses;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  current._M_dataplus._M_p = (pointer)&current.field_2;
  current._M_string_length = 0;
  current.field_2._M_local_buf[0] = '\0';
  local_108 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__return_storage_ptr__;
  ::std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>(&parentheses);
  for (uVar2 = 0; uVar2 < str->_M_string_length; uVar2 = uVar2 + 1) {
    ch = (str->_M_dataplus)._M_p[uVar2];
    if (ch == par_open) {
      std::deque<char,_std::allocator<char>_>::push_back(&parentheses.c,&ch);
    }
    if (ch == par_close) {
      if (parentheses.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          parentheses.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"Incongruent parentheses in string: \'%s\'",&local_109);
        ::std::__cxx11::string::string((string *)&local_50,(string *)str);
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (pIVar1,&local_e0,&local_50);
        __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      std::deque<char,_std::allocator<char>_>::pop_back(&parentheses.c);
    }
    if ((parentheses.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
         ._M_finish._M_cur ==
         parentheses.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data
         ._M_start._M_cur) && (ch == delimiter)) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_108,&current);
      current._M_string_length = 0;
      *current._M_dataplus._M_p = '\0';
    }
    else {
      ::std::__cxx11::string::push_back('\0');
    }
  }
  if (current._M_string_length != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_108,&current);
  }
  if (parentheses.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur ==
      parentheses.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
              ((_Deque_base<char,_std::allocator<char>_> *)&parentheses);
    ::std::__cxx11::string::~string((string *)&current);
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)local_108;
  }
  pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_e0,"Incongruent parentheses in string: \'%s\'",(allocator *)&ch);
  ::std::__cxx11::string::string((string *)&local_70,(string *)str);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar1,&local_e0,&local_70);
  __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<string> StringUtil::SplitWithParentheses(const string &str, char delimiter, char par_open, char par_close) {
	vector<string> result;
	string current;
	stack<char> parentheses;

	for (size_t i = 0; i < str.size(); ++i) {
		char ch = str[i];

		// stack to keep track if we are within parentheses
		if (ch == par_open) {
			parentheses.push(ch);
		}
		if (ch == par_close) {
			if (!parentheses.empty()) {
				parentheses.pop();
			} else {
				throw InvalidInputException("Incongruent parentheses in string: '%s'", str);
			}
		}
		// split if not within parentheses
		if (parentheses.empty() && ch == delimiter) {
			result.push_back(current);
			current.clear();
		} else {
			current += ch;
		}
	}
	// Add the last segment
	if (!current.empty()) {
		result.push_back(current);
	}
	if (!parentheses.empty()) {
		throw InvalidInputException("Incongruent parentheses in string: '%s'", str);
	}
	return result;
}